

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::copyTexSubImage1D
          (ReferenceContext *this,deUint32 target,int level,int xoffset,int x,int y,int width)

{
  Texture1D *pTVar1;
  long lVar2;
  pointer pTVar3;
  Texture1D *pTVar4;
  MultisampleConstPixelBufferAccess src;
  MultisamplePixelBufferAccess local_90;
  MultisampleConstPixelBufferAccess local_68;
  
  pTVar3 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
  getReadColorbuffer(&local_90,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_68,&local_90);
  if ((-1 < xoffset) && (-1 < width)) {
    if ((local_68.m_access.m_size.m_data[0] == 0) ||
       ((local_68.m_access.m_size.m_data[1] == 0 || (local_68.m_access.m_size.m_data[2] == 0)))) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x502;
      return;
    }
    if (target != 0xde0) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    pTVar1 = pTVar3->tex1DBinding;
    pTVar4 = &pTVar3->default1DTex;
    if (pTVar1 != (Texture1D *)0x0) {
      pTVar4 = pTVar1;
    }
    if (((uint)level < 0xe) && (*(long *)((long)((pTVar4->m_levels).m_data + (uint)level) + 8) != 0)
       ) {
      local_90.m_access.super_ConstPixelBufferAccess.m_format =
           *(TextureFormat *)((pTVar4->m_levels).m_access + (uint)level);
      lVar2 = 0;
      do {
        local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar2] =
             *(int *)((long)((pTVar4->m_levels).m_access + (uint)level) + 8U + lVar2 * 4);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      lVar2 = 0;
      do {
        local_90.m_access.super_ConstPixelBufferAccess.m_pitch.m_data[lVar2] =
             *(int *)((long)((pTVar4->m_levels).m_access + (uint)level) + 0x14U + lVar2 * 4);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      local_90.m_access.super_ConstPixelBufferAccess.m_data =
           *(void **)((long)((pTVar4->m_levels).m_access + (uint)level) + 0x20);
      if (width + xoffset <= local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[0]) {
        if (width == 0) {
          return;
        }
        do {
          if ((-1 < x) && (x < local_68.m_access.m_size.m_data[1])) {
            rr::resolveMultisamplePixel
                      ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&local_68,
                       x);
            tcu::PixelBufferAccess::setPixel
                      (&local_90.m_access,(Vec4 *)&stack0xffffffffffffffc0,xoffset,0,0);
          }
          xoffset = xoffset + 1;
          x = x + 1;
          width = width + -1;
        } while (width != 0);
        return;
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::copyTexSubImage1D (deUint32 target, int level, int xoffset, int x, int y, int width)
{
	TextureUnit&							unit	= m_textureUnits[m_activeTexture];
	rr::MultisampleConstPixelBufferAccess	src		= getReadColorbuffer();

	RC_IF_ERROR(xoffset < 0,	GL_INVALID_VALUE,		RC_RET_VOID);
	RC_IF_ERROR(width < 0,		GL_INVALID_VALUE,		RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src),	GL_INVALID_OPERATION,	RC_RET_VOID);

	if (target == GL_TEXTURE_1D)
	{
		Texture1D& texture = unit.tex1DBinding ? *unit.tex1DBinding : unit.default1DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width > dst.getWidth(), GL_INVALID_VALUE, RC_RET_VOID);

		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()))
				continue;

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y), xo+xoffset, 0);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}